

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

bool __thiscall mjs::object::property::key_matches(property *this,gc_heap *h,wstring_view k)

{
  bool bVar1;
  int iVar2;
  gc_string *pgVar3;
  
  pgVar3 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference(&this->key_,h);
  if ((ulong)pgVar3->length_ == k._M_len) {
    if (pgVar3->length_ != 0) {
      iVar2 = wmemcmp((wchar_t *)(pgVar3 + 1),k._M_str,k._M_len);
      if (iVar2 != 0) goto LAB_001511f6;
    }
    bVar1 = true;
  }
  else {
LAB_001511f6:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool key_matches(gc_heap& h, const std::wstring_view k) { return key_.dereference(h).view() == k; }